

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderLogCase::iterate(ShaderLogCase *this)

{
  size_type *this_00;
  TestLog *log;
  bool bVar1;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  deUint32 type_00;
  GLuint shader;
  GLenum GVar3;
  undefined4 extraout_var;
  char *__s;
  allocator<char> local_2c9;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> logLen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  char *brokenSource;
  code *local_218;
  GLenum local_210;
  string source;
  ResultCollector result;
  string glslVersionDecl;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDecl,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&source);
  tcu::ResultCollector::ResultCollector(&result,log,&glslVersionDecl);
  std::__cxx11::string::~string((string *)&glslVersionDecl);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDecl,__s,(allocator<char> *)&local_2a0);
  std::operator+(&source,&glslVersionDecl,"\nbroken, this should not compile,\n{");
  std::__cxx11::string::~string((string *)&glslVersionDecl);
  brokenSource = source._M_dataplus._M_p;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&logLen);
  gl.m_enableLog = true;
  glslVersionDecl._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &glslVersionDecl._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Trying to compile broken shader source.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&glslVersionDecl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  type_00 = glu::getGLShaderType(this->m_shaderType);
  shader = glu::CallLogWrapper::glCreateShader(&gl,type_00);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Got Error ",&local_2c9)
    ;
    local_218 = glu::getErrorName;
    local_210 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_280,&local_218);
    std::operator+(&local_240,&local_260,&local_280);
    std::operator+(&local_2a0,&local_240,": ");
    std::operator+(&glslVersionDecl,&local_2a0,"create shader");
    tcu::ResultCollector::fail(&result,&glslVersionDecl);
    std::__cxx11::string::~string((string *)&glslVersionDecl);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  glu::CallLogWrapper::glShaderSource(&gl,shader,1,&brokenSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&gl,shader);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Got Error ",&local_2c9)
    ;
    local_218 = glu::getErrorName;
    local_210 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_280,&local_218);
    std::operator+(&local_240,&local_260,&local_280);
    std::operator+(&local_2a0,&local_240,": ");
    std::operator+(&glslVersionDecl,&local_2a0,"compile");
    tcu::ResultCollector::fail(&result,&glslVersionDecl);
    std::__cxx11::string::~string((string *)&glslVersionDecl);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  glu::CallLogWrapper::glGetShaderiv(&gl,shader,0x8b84,&logLen.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&logLen,&result);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::isUndefined(&logLen);
  if (!bVar1) {
    verifyInfoLogQuery((Functional *)&result,(ResultCollector *)&gl,
                       (CallLogWrapper *)(ulong)(uint)logLen.m_value,shader,0x1571946,0,
                       "glGetShaderInfoLog");
  }
  glu::CallLogWrapper::glDeleteShader(&gl,shader);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Got Error ",&local_2c9)
    ;
    local_218 = glu::getErrorName;
    local_210 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_280,&local_218);
    std::operator+(&local_240,&local_260,&local_280);
    std::operator+(&local_2a0,&local_240,": ");
    std::operator+(&glslVersionDecl,&local_2a0,"delete");
    tcu::ResultCollector::fail(&result,&glslVersionDecl);
    std::__cxx11::string::~string((string *)&glslVersionDecl);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::__cxx11::string::~string((string *)&source);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

ShaderLogCase::IterateResult ShaderLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result			(m_testCtx.getLog());
	glu::CallLogWrapper						gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	deUint32								shader			= 0;
	const std::string						source			= brokenShaderSource(m_context.getRenderContext().getType());
	const char* const						brokenSource	= source.c_str();
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to compile broken shader source." << tcu::TestLog::EndMessage;

	shader = gl.glCreateShader(glu::getGLShaderType(m_shaderType));
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "create shader");

	gl.glShaderSource(shader, 1, &brokenSource, DE_NULL);
	gl.glCompileShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "compile");

	gl.glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (!logLen.isUndefined())
		verifyInfoLogQuery(result, gl, logLen, shader, &glu::CallLogWrapper::glGetShaderInfoLog, "glGetShaderInfoLog");

	gl.glDeleteShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "delete");

	result.setTestContextResult(m_testCtx);
	return STOP;
}